

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::getDualsDoubletonEquation(HPresolve *this,int row,int col)

{
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double colUpp;
  double colLow;
  double colUpp_00;
  double dVar4;
  int iVar5;
  int iVar6;
  pointer piVar7;
  pointer piVar8;
  int j;
  _Elt_pointer pdVar9;
  ostream *poVar10;
  pointer pdVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  _Elt_pointer ppVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double up;
  double lo;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  double local_a0;
  double local_98;
  vector<double,_std::allocator<double>_> local_90;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double local_60;
  double local_58;
  int local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  this_00 = &(this->super_HPreData).oldBounds;
  ppVar17 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar17 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar17 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  local_50 = ppVar17[-1].first;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&ppVar17[-1].second);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&this_00->c);
  std::vector<double,_std::allocator<double>_>::vector(&local_90,&local_48);
  j = local_50;
  ppVar17 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar17 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar17 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  uVar21 = (ulong)local_50;
  dVar1 = *local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  dVar23 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  local_50 = ppVar17[-1].first;
  std::vector<double,_std::allocator<double>_>::operator=(&local_48,&ppVar17[-1].second);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&this_00->c);
  std::vector<double,_std::allocator<double>_>::operator=(&local_90,&local_48);
  ppVar17 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar17 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar17 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  dVar3 = *local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  colUpp = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  dVar22 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  local_50 = ppVar17[-1].first;
  std::vector<double,_std::allocator<double>_>::operator=(&local_48,&ppVar17[-1].second);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&this_00->c);
  std::vector<double,_std::allocator<double>_>::operator=(&local_90,&local_48);
  this_01 = &(this->super_HPreData).postValue;
  pdVar9 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  colLow = *local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  colUpp_00 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1];
  local_78 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2];
  local_58 = pdVar9[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&this_01->c);
  pdVar9 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  local_60 = pdVar9[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&this_01->c);
  pdVar9 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  local_68 = pdVar9[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&this_01->c);
  pdVar11 = (this->super_HPreData).valuePrimal.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(this->super_HPreData).valuePrimal.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar11 >> 3;
  uVar12 = uVar21;
  if ((uVar14 <= uVar21) || (uVar20 = (ulong)col, uVar12 = uVar20, uVar14 <= uVar20)) {
LAB_00147ca3:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
  }
  dVar4 = pdVar11[uVar21];
  dVar24 = (local_58 - local_68 * dVar4) / local_60;
  pdVar11[uVar20] = dVar24;
  this->objShift = local_78 * dVar24 + (dVar22 * dVar4 - dVar23 * dVar4) + this->objShift;
  pdVar11 = (this->super_HPreData).colCostAtEl.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar12 = uVar21;
  if ((ulong)((long)(this->super_HPreData).colCostAtEl.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar21)
  goto LAB_00147ca3;
  pdVar11[uVar21] = dVar22;
  piVar7 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((ulong)((long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2) <= uVar20) ||
     (piVar8 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     (ulong)((long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar20)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
  }
  iVar5 = piVar7[uVar20];
  iVar6 = piVar8[uVar20];
  uVar12 = (ulong)iVar6;
  if (iVar6 < iVar5) {
    piVar7 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
    uVar18 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar14 = uVar12;
    if (uVar12 < uVar15) {
      uVar14 = uVar15;
    }
    do {
      uVar16 = uVar15;
      uVar19 = uVar14;
      if ((uVar15 <= uVar12) || (uVar19 = (ulong)piVar7[uVar12], uVar16 = uVar18, uVar18 <= uVar19))
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar19,uVar16);
      }
      uVar12 = uVar12 + 1;
    } while ((long)iVar5 != uVar12);
  }
  uStack_70 = 0;
  local_98 = -1e+200;
  local_a0 = 1e+200;
  local_78 = dVar4;
  getBoundOnLByZj(this,row,j,&local_98,&local_a0,dVar3,colUpp);
  getBoundOnLByZj(this,row,col,&local_98,&local_a0,colLow,colUpp_00);
  dVar22 = local_98;
  dVar23 = local_a0;
  if (this->tol <= local_98 - local_a0 && local_98 - local_a0 != this->tol) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Error in postsolving doubleton equation ",0x2c);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,row);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10," : inconsistent bounds for it\'s dual value.\n",0x2c);
  }
  if ((0.0 < dVar22) || (dVar23 < 0.0)) {
    if (dVar22 <= 0.0) {
      if (0.0 <= dVar23) goto LAB_00147a59;
      pdVar11 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar12 = (long)(this->super_HPreData).valueRowDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
      uVar14 = (long)row;
      dVar22 = dVar23;
      if (uVar12 <= (ulong)(long)row) goto LAB_00147c81;
    }
    else {
      pdVar11 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar12 = (long)(this->super_HPreData).valueRowDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
      uVar14 = (long)row;
      if (uVar12 <= (ulong)(long)row) goto LAB_00147c81;
    }
    pdVar11[row] = dVar22;
  }
  else {
    uVar14 = (ulong)row;
    pdVar11 = (this->super_HPreData).valueRowDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    uVar12 = (long)(this->super_HPreData).valueRowDual.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
    if (uVar12 <= uVar14) goto LAB_00147c81;
    pdVar11[uVar14] = 0.0;
  }
LAB_00147a59:
  uVar14 = (ulong)row;
  piVar7 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
  if (uVar14 < uVar12) {
    piVar7[uVar14] = 1;
    dVar23 = getColumnDualPost(this,col);
    pdVar11 = (this->super_HPreData).valueColDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    uVar12 = (long)(this->super_HPreData).valueColDual.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
    uVar14 = uVar20;
    if (uVar20 < uVar12) {
      pdVar11[uVar20] = dVar23;
      dVar23 = getColumnDualPost(this,j);
      pdVar11 = (this->super_HPreData).valueColDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar12 = (long)(this->super_HPreData).valueColDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
      uVar14 = uVar21;
      if (uVar21 < uVar12) {
        pdVar11[uVar21] = dVar23;
        if (this->iKKTcheck == 1) {
          pdVar11 = (this->super_HPreData).chk.colDual.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = (long)(this->super_HPreData).chk.colDual.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
          if (uVar12 <= uVar21) goto LAB_00147c81;
          pdVar11[uVar21] = dVar23;
        }
        piVar7 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = (long)(this->super_HPreData).nonbasicFlag.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish - (long)piVar7 >> 2;
        uVar12 = uVar15;
        if (uVar21 < uVar15) {
          piVar13 = piVar7 + uVar21;
          if ((((*piVar13 != 1) || (local_78 != dVar2)) || (colUpp <= dVar2)) &&
             (((*piVar13 != 1 || (local_78 != dVar1)) || (dVar1 <= dVar3)))) {
            pdVar11 = (this->super_HPreData).valuePrimal.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar12 = (long)(this->super_HPreData).valuePrimal.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
            uVar14 = uVar20;
            if (uVar12 <= uVar20) goto LAB_00147c81;
            dVar23 = pdVar11[uVar20];
            dVar3 = this->tol;
            if (((dVar3 < dVar23 - colLow) && (dVar3 < colUpp_00 - dVar23)) ||
               ((ABS(local_78 - dVar2) < dVar3 || (ABS(local_78 - dVar1) < dVar3)))) {
              uVar12 = uVar15;
              if (uVar15 <= uVar20) goto LAB_00147c81;
              piVar13 = piVar7 + uVar20;
            }
            else {
              piVar13 = piVar7 + (long)row + (long)(this->super_HPreData).numColOriginal;
            }
          }
          *piVar13 = 0;
          piVar7 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar12 = (long)(this->super_HPreData).flagCol.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
          uVar14 = uVar20;
          if (uVar20 < uVar12) {
            piVar7[uVar20] = 1;
            if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            return;
          }
        }
      }
    }
  }
LAB_00147c81:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
             uVar12);
}

Assistant:

void HPresolve::getDualsDoubletonEquation(int row, int col) {
	// colDual already set. need valuePrimal from stack. maybe change rowDual depending on bounds. old bounds kept in oldBounds.
	// variables j,k : we eliminated col(k)(c.col) and are left with changed bounds on j and no row.
	//                               y                                                 x

	pair< int ,vector<double> > p = oldBounds.top(); oldBounds.pop();
	vector<double> v = get<1>(p);
	int x = get<0>(p);
	double ubxNew = v[1];
	double lbxNew = v[0];
	double cxNew = v[2];
	p = oldBounds.top(); oldBounds.pop();
	v = get<1>(p);
	double ubxOld = v[1];
	double lbxOld = v[0];
	double cxOld = v[2];
	p = oldBounds.top(); oldBounds.pop();
	v = get<1>(p);
	double uby = v[1];
	double lby = v[0];
	double cy = v[2];

	int y = col;

	double b = postValue.top(); postValue.pop();
	double aky = postValue.top(); postValue.pop();
	double akx = postValue.top(); postValue.pop();
	double valueX = valuePrimal.at(x);

	// primal value and objective shift
	valuePrimal.at(y) = (b - akx*valueX)/aky;
	objShift += -cxNew*valueX + cxOld*valueX + cy*valuePrimal.at(y);

	//column cost of x
	colCostAtEl.at(x) = cxOld;


	//get nzCol.at(y) before unflag row as missing
	int nzy = Aend.at(y) - Astart.at(y);
	for (int kk=Astart.at(y); kk<Aend.at(y); ++kk)
		if (!flagRow.at(Aindex.at(kk)))
			nzy--;


	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	getBoundOnLByZj(row, x, &lo, &up, lbxOld, ubxOld);
	getBoundOnLByZj(row, y, &lo, &up, lby,    uby);

		//calculate yi
	if (lo-up > tol)
		cout<<"PR: Error in postsolving doubleton equation "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;
	valueColDual.at(y) = getColumnDualPost(y);
	valueColDual.at(x) = getColumnDualPost(x);

	if (iKKTcheck == 1)
		chk.colDual.at(x) = valueColDual.at(x);

	if ((nonbasicFlag.at(x) == 1 && valueX==ubxNew && ubxNew < ubxOld)  ||
		(nonbasicFlag.at(x) == 1 && valueX==lbxNew && lbxNew > lbxOld))   {
			nonbasicFlag.at(x) = 0;
	}
	else {
		//row becomes basic unless y is between bounds, in which case y is basic
		if (valuePrimal.at(y) - lby > tol  && uby - valuePrimal.at(y) > tol) {
			nonbasicFlag.at(y) = 0;
		}
		else if (abs(valueX-ubxNew ) < tol || abs(valueX-lbxNew ) < tol)
			nonbasicFlag.at(y) = 0;
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}

	//flagRow.at(row) = true;
	flagCol.at(y) = 1;
}